

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall
CFFFileInput::ReadCFFFile
          (CFFFileInput *this,IByteReaderWithPosition *inCFFFile,unsigned_short inFontIndex)

{
  EStatusCode EVar1;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  EVar1 = ReadCFFFileByIndexOrName(this,inCFFFile,&local_40,inFontIndex);
  std::__cxx11::string::~string((string *)&local_40);
  return EVar1;
}

Assistant:

EStatusCode CFFFileInput::ReadCFFFile(IByteReaderWithPosition* inCFFFile,unsigned short inFontIndex)
{
	return ReadCFFFileByIndexOrName(inCFFFile,"",inFontIndex);
}